

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::World::getTrainsOfPlayer(World *this,Player *player)

{
  pointer ppVar1;
  map<const_tiger::trains::world::Player_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  map<const_tiger::trains::world::Player_*,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>,_std::less<const_tiger::trains::world::Player_*>,_std::allocator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>_>
  ::find(in_stack_ffffffffffffffe8,(key_type *)0x224524);
  ppVar1 = std::
           _Rb_tree_const_iterator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_tiger::trains::world::Player_*const,_std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>_>_>
                         *)0x224530);
  return &ppVar1->second;
}

Assistant:

const std::vector<Train *> &World::getTrainsOfPlayer(const Player *player) const
{
    return trainsOfPlayer.find(player)->second;
}